

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::CalculateP2SH(Address *this,ByteData160 *hash_data,uint8_t prefix)

{
  const_reference this_00;
  uchar *bytes;
  size_type bytes_len;
  string *message;
  undefined8 uVar1;
  char *wally_string;
  AddressFormatData *in_stack_fffffffffffffe68;
  AddressFormatData *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  allocator *paVar2;
  CfdError error_code;
  CfdException *this_01;
  string local_138;
  undefined1 local_112;
  allocator local_111;
  string local_110 [38];
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  StringUtil local_c8 [32];
  CfdSourceLocation local_a8;
  CfdSourceLocation local_90;
  int local_78;
  uint32_t local_74;
  int ret;
  uint32_t flags;
  char *output;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  uint8_t local_39;
  undefined1 local_38 [7];
  uint8_t addr_prefix;
  vector<unsigned_char,_std::allocator<unsigned_char>_> address_data;
  uint8_t prefix_local;
  ByteData160 *hash_data_local;
  Address *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  address_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = prefix;
  ByteData160::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,hash_data)
  ;
  local_39 = address_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_;
  if (((address_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ == '\0') && (kCfdUnknownError < this->type_)
      ) && (this->type_ < kCfdOutOfRangeError)) {
    this_00 = ::std::
              vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
              operator[]((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)kBitcoinAddressFormatList,(ulong)(uint)this->type_);
    local_39 = AddressFormatData::GetP2shPrefix(this_00);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator[]((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)kBitcoinAddressFormatList,(ulong)(uint)this->type_);
    AddressFormatData::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    SetNetType(this,&this->format_data_);
  }
  local_60._M_current =
       (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffe68);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_58,&local_60);
  output = (char *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                              local_58,&local_39);
  _ret = (WallyUtil *)0x0;
  local_74 = 1;
  this_01 = (CfdException *)local_38;
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x45c656);
  bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  local_78 = wally_base58_from_bytes(bytes,bytes_len,local_74,(char **)&ret);
  if (local_78 != 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x348;
    local_90.funcname = "CalculateP2SH";
    logger::warn<int&>(&local_90,"wally_base58_from_bytes error. ret={}.",&local_78);
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x34a;
    local_a8.funcname = "CalculateP2SH";
    StringUtil::ByteToString_abi_cxx11_
              (local_c8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    logger::info<std::__cxx11::string>
              (&local_a8,"input hash={}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    ::std::__cxx11::string::~string((string *)local_c8);
    if (local_78 == -2) {
      local_ea = 1;
      message = (string *)__cxa_allocate_exception(0x30);
      paVar2 = &local_e9;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e8,"Base58 encode error.",paVar2);
      CfdException::CfdException(this_01,(CfdError)((ulong)paVar2 >> 0x20),message);
      local_ea = 0;
      __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_112 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_110,"Base58 encode error.",&local_111);
    CfdException::CfdException(this_01,error_code,in_stack_fffffffffffffe80);
    local_112 = 0;
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WallyUtil::ConvertStringAndFree_abi_cxx11_(&local_138,_ret,wally_string);
  ::std::__cxx11::string::operator=((string *)&this->address_,(string *)&local_138);
  ::std::__cxx11::string::~string((string *)&local_138);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void Address::CalculateP2SH(const ByteData160& hash_data, uint8_t prefix) {
  std::vector<uint8_t> address_data = hash_data.GetBytes();

  // Add first to the list the Address Prefix
  uint8_t addr_prefix = prefix;
  if ((addr_prefix == 0) && (kMainnet <= type_) && (type_ <= kRegtest)) {
    addr_prefix = kBitcoinAddressFormatList[type_].GetP2shPrefix();
    format_data_ = kBitcoinAddressFormatList[type_];
    SetNetType(format_data_);
  }
  address_data.insert(address_data.begin(), addr_prefix);

  char* output = NULL;
  uint32_t flags = BASE58_FLAG_CHECKSUM;
  int ret = wally_base58_from_bytes(
      address_data.data(), address_data.size(), flags, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_from_bytes error. ret={}.", ret);
    info(
        CFD_LOG_SOURCE, "input hash={}",
        StringUtil::ByteToString(address_data));
    if (ret == WALLY_EINVAL) {
      throw CfdException(kCfdIllegalArgumentError, "Base58 encode error.");
    } else {
      throw CfdException(kCfdInternalError, "Base58 encode error.");
    }
  }

  address_ = WallyUtil::ConvertStringAndFree(output);
}